

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

void helicsInputSetInfo(HelicsInput inp,char *info,HelicsError *err)

{
  Interface *this;
  HelicsInput pvVar1;
  size_t sVar2;
  _Alloc_hider _Var3;
  string_view info_00;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (inp == (HelicsInput)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001aa240;
    }
    else {
      pvVar1 = (HelicsInput)0x0;
      if (*inp == 0x3456e052) {
        pvVar1 = inp;
      }
      if (*inp == 0x3456e052 || err == (HelicsError *)0x0) goto LAB_001aa242;
    }
    err->error_code = -3;
    err->message = "The given input object does not point to a valid object";
  }
LAB_001aa240:
  pvVar1 = (HelicsInput)0x0;
LAB_001aa242:
  if (pvVar1 != (HelicsInput)0x0) {
    this = *(Interface **)((long)pvVar1 + 0x18);
    sVar2 = gHelicsEmptyStr_abi_cxx11_._M_string_length;
    _Var3._M_p = gHelicsEmptyStr_abi_cxx11_._M_dataplus._M_p;
    if (info != (char *)0x0) {
      sVar2 = strlen(info);
      _Var3._M_p = info;
    }
    info_00._M_str = _Var3._M_p;
    info_00._M_len = sVar2;
    helics::Interface::setInfo(this,info_00);
  }
  return;
}

Assistant:

void helicsInputSetInfo(HelicsInput inp, const char* info, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return;
    }
    try {
        inpObj->inputPtr->setInfo(AS_STRING_VIEW(info));
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}